

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void parse_body(LexState *ls,ExpDesc *e,int needself,BCLine line)

{
  long lVar1;
  BCPos BVar2;
  FuncState *fs_00;
  GCobj *gc;
  BCPos *in_RSI;
  long *in_RDI;
  ptrdiff_t oldbase;
  GCproto *pt;
  FuncScope bl;
  FuncState *pfs;
  FuncState fs;
  FuncState *in_stack_fffffffffffffcc0;
  LexState *in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcd8;
  int needself_00;
  FuncState *in_stack_fffffffffffffce0;
  BCLine in_stack_fffffffffffffd14;
  FuncState *in_stack_fffffffffffffd18;
  byte local_2b0;
  
  needself_00 = (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
  lVar1 = *in_RDI;
  fs_00 = (FuncState *)(*(long *)(lVar1 + 0x48) - in_RDI[0x12] >> 3);
  fs_init(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  fscope_begin((FuncState *)&stack0xfffffffffffffcf8,(FuncScope *)&stack0xfffffffffffffce0,0);
  parse_params((LexState *)in_stack_fffffffffffffce0,needself_00);
  bcemit_INS(fs_00,(BCIns)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
  parse_chunk((LexState *)in_stack_fffffffffffffcc0);
  if (*(int *)((long)in_RDI + 0x34) != 0x106) {
    lex_match((LexState *)fs_00,(LexToken)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
              (LexToken)in_stack_fffffffffffffcc8,(BCLine)((ulong)in_stack_fffffffffffffcc0 >> 0x20)
             );
  }
  *(int *)((long)in_RDI + 100) = (int)in_RDI[0xc];
  gc = (GCobj *)fs_finish((LexState *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd14);
  *(long *)(lVar1 + 0x48) = in_RDI[0x12] + (long)fs_00 * 8;
  *(int *)(lVar1 + 0x50) = (int)in_RDI[0x13] - (int)fs_00;
  const_gc(in_stack_fffffffffffffce0,gc,(uint32_t)((ulong)fs_00 >> 0x20));
  BVar2 = bcemit_INS(fs_00,(BCIns)((ulong)in_RSI >> 0x20));
  in_RSI[2] = 0xb;
  *in_RSI = BVar2;
  in_RSI[3] = 0xffffffff;
  in_RSI[4] = 0xffffffff;
  *(byte *)(lVar1 + 0x58) = *(byte *)(lVar1 + 0x58) | local_2b0 & 4;
  if ((*(byte *)(lVar1 + 0x58) & 1) == 0) {
    if ((*(byte *)(lVar1 + 0x58) & 0x20) != 0) {
      *(byte *)(lVar1 + 0x58) = *(byte *)(lVar1 + 0x58) | 0x40;
    }
    *(byte *)(lVar1 + 0x58) = *(byte *)(lVar1 + 0x58) | 1;
  }
  lj_lex_next((LexState *)0x14bd53);
  return;
}

Assistant:

static void parse_body(LexState *ls, ExpDesc *e, int needself, BCLine line)
{
  FuncState fs, *pfs = ls->fs;
  FuncScope bl;
  GCproto *pt;
  ptrdiff_t oldbase = pfs->bcbase - ls->bcstack;
  fs_init(ls, &fs);
  fscope_begin(&fs, &bl, 0);
  fs.linedefined = line;
  fs.numparams = (uint8_t)parse_params(ls, needself);
  fs.bcbase = pfs->bcbase + pfs->pc;
  fs.bclim = pfs->bclim - pfs->pc;
  bcemit_AD(&fs, BC_FUNCF, 0, 0);  /* Placeholder. */
  parse_chunk(ls);
  if (ls->tok != TK_end) lex_match(ls, TK_end, TK_function, line);
  pt = fs_finish(ls, (ls->lastline = ls->linenumber));
  pfs->bcbase = ls->bcstack + oldbase;  /* May have been reallocated. */
  pfs->bclim = (BCPos)(ls->sizebcstack - oldbase);
  /* Store new prototype in the constant array of the parent. */
  expr_init(e, VRELOCABLE,
	    bcemit_AD(pfs, BC_FNEW, 0, const_gc(pfs, obj2gco(pt), LJ_TPROTO)));
#if LJ_HASFFI
  pfs->flags |= (fs.flags & PROTO_FFI);
#endif
  if (!(pfs->flags & PROTO_CHILD)) {
    if (pfs->flags & PROTO_HAS_RETURN)
      pfs->flags |= PROTO_FIXUP_RETURN;
    pfs->flags |= PROTO_CHILD;
  }
  lj_lex_next(ls);
}